

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetCommandListAppendMetricStreamerMarkerPrologue
          (ZETHandleLifetimeValidation *this,zet_command_list_handle_t hCommandList,
          zet_metric_streamer_handle_t hMetricStreamer,uint32_t value)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hCommandList);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    bVar2 = HandleLifetimeValidation::isOpen
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hCommandList);
    zVar3 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
    if (bVar2) {
      bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricStreamer);
      zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      if (bVar2) {
        zVar3 = ZE_RESULT_SUCCESS;
      }
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetCommandListAppendMetricStreamerMarkerPrologue(
        zet_command_list_handle_t hCommandList,         ///< [in] handle of the command list
        zet_metric_streamer_handle_t hMetricStreamer,   ///< [in] handle of the metric streamer
        uint32_t value                                  ///< [in] streamer marker value
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (!context.handleLifetime->isOpen( hCommandList )){
            return ZE_RESULT_ERROR_INVALID_ARGUMENT;
        }
        if ( !context.handleLifetime->isHandleValid( hMetricStreamer )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }